

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.h
# Opt level: O3

void __thiscall
KDIS::PDU::Transmitter_PDU::SetRadioEntityType(Transmitter_PDU *this,RadioEntityType *Type)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT16 KVar5;
  
  KVar1 = Type->m_ui8Domain;
  KVar2 = Type->m_ui16Country;
  KVar3 = Type->m_ui8Category;
  KVar4 = Type->m_ui8NomenclatureVersion;
  KVar5 = Type->m_ui16Nomenclature;
  (this->m_RadioEntityType).m_ui8EntityKind = Type->m_ui8EntityKind;
  (this->m_RadioEntityType).m_ui8Domain = KVar1;
  (this->m_RadioEntityType).m_ui16Country = KVar2;
  (this->m_RadioEntityType).m_ui8Category = KVar3;
  (this->m_RadioEntityType).m_ui8NomenclatureVersion = KVar4;
  (this->m_RadioEntityType).m_ui16Nomenclature = KVar5;
  return;
}

Assistant:

class KDIS_EXPORT RadioEntityType : public DataTypeBase
{
protected:

    KUINT8 m_ui8EntityKind;

    KUINT8 m_ui8Domain;

    KUINT16 m_ui16Country;

    KUINT8 m_ui8Category;

    KUINT8 m_ui8NomenclatureVersion;

    KUINT16 m_ui16Nomenclature;

public:

    static const KUINT16 RADIO_ENTITY_TYPE_SIZE = 8;

    RadioEntityType();

    RadioEntityType( KDIS::DATA_TYPE::ENUMS::EntityKind Kind, KUINT8 Domain, 
		             KDIS::DATA_TYPE::ENUMS::Country Country, KUINT8 Categoy, KUINT8 NomenclatureVersion,
					 KUINT16 Nomenclature );

    RadioEntityType( KUINT8 Kind, KUINT8 Domain, KUINT8 Country, KUINT8 Categoy,
                     KUINT8 NomenclatureVersion, KUINT16 Nomenclature );

    RadioEntityType(KDataStream &stream) noexcept(false);

    virtual ~RadioEntityType();

    //************************************
    // FullName:    KDIS::DATA_TYPE::RadioEntityType::SetEntityKind
    //              KDIS::DATA_TYPE::RadioEntityType::GetEntityKind
    // Description: Kind
    // Parameter:   EntityKind UI
    //************************************
    void SetEntityKind( KDIS::DATA_TYPE::ENUMS::EntityKind UI );
    KDIS::DATA_TYPE::ENUMS::EntityKind GetEntityKind() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RadioEntityType::SetDomain
    //              KDIS::DATA_TYPE::RadioEntityType::GetDomain
    // Description: Domain
    // Parameter:   EntityDomain UI
    //************************************
    void SetDomain( KDIS::DATA_TYPE::ENUMS::EntityDomain UI );
    KDIS::DATA_TYPE::ENUMS::EntityDomain GetDomain() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RadioEntityType::SetCountry
    //              KDIS::DATA_TYPE::RadioEntityType::GetCountry
    // Description: Country
    // Parameter:   Country UI
    //************************************
    void SetCountry( KDIS::DATA_TYPE::ENUMS::Country UI );
    KDIS::DATA_TYPE::ENUMS::Country GetCountry() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RadioEntityType::SetCategory
    //              KDIS::DATA_TYPE::RadioEntityType::GetCategory
    // Description: Category
    // Parameter:   KUINT8 UI
    //************************************
    void SetCategory( KUINT8 UI );
    KUINT8 GetCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RadioEntityType::SetNomenclatureVersion
    //              KDIS::DATA_TYPE::RadioEntityType::GetNomenclatureVersion
    // Description: Nomenclature Version
    // Parameter:   KUINT8 UI
    //************************************
    void SetNomenclatureVersion( KUINT8 NV );
    KUINT8 GetNomenclatureVersion() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RadioEntityType::SetNomenclature
    //              KDIS::DATA_TYPE::RadioEntityType::GetNomenclature
    // Description: Nomenclature
    // Parameter:   KINT16 N
    //************************************
    void SetNomenclature( KUINT16 N );
    KUINT16 GetNomenclature() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RadioEntityType::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RadioEntityType::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::RadioEntityType::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const RadioEntityType & Value ) const;
    KBOOL operator != ( const RadioEntityType & Value ) const;
}